

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getRowsByMask(void *highs,HighsInt *mask,HighsInt *num_row,double *lower,
                            double *upper,HighsInt *num_nz,HighsInt *matrix_start,
                            HighsInt *matrix_index,double *matrix_value)

{
  HighsStatus HVar1;
  undefined4 *in_RDX;
  undefined4 *in_R9;
  HighsStatus status;
  HighsInt local_num_nz;
  HighsInt local_num_row;
  HighsInt *in_stack_00000058;
  HighsInt *in_stack_00000078;
  double *in_stack_00000080;
  undefined4 local_38;
  undefined4 local_34;
  
  HVar1 = Highs::getRows((Highs *)matrix_start,in_stack_00000058,(HighsInt *)highs,(double *)mask,
                         (double *)num_row,(HighsInt *)lower,(HighsInt *)matrix_value,
                         in_stack_00000078,in_stack_00000080);
  *in_RDX = local_34;
  *in_R9 = local_38;
  return HVar1;
}

Assistant:

HighsInt Highs_getRowsByMask(const void* highs, const HighsInt* mask,
                             HighsInt* num_row, double* lower, double* upper,
                             HighsInt* num_nz, HighsInt* matrix_start,
                             HighsInt* matrix_index, double* matrix_value) {
  HighsInt local_num_row, local_num_nz;
  HighsStatus status =
      ((Highs*)highs)
          ->getRows(mask, local_num_row, lower, upper, local_num_nz,
                    matrix_start, matrix_index, matrix_value);
  *num_row = local_num_row;
  *num_nz = local_num_nz;
  return (HighsInt)status;
}